

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

time_double
time_function<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)0>>
          (random_numerators<unsigned_long> *vals,
          divider<unsigned_long,_(libdivide::Branching)0> denom,
          pFuncToTime<unsigned_long,_libdivide::divider<unsigned_long>_> timeFunc)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  undefined1 auVar3 [16];
  time_double tVar4;
  timer t;
  divider<unsigned_long,_(libdivide::Branching)0> local_58;
  timer local_48;
  
  local_58.div.denom.more = denom.div.denom.more;
  local_58.div.denom.magic = denom.div.denom.magic;
  timer::start(&local_48);
  uVar2 = (*timeFunc)(vals,&local_58);
  timer::stop(&local_48);
  auVar1 = vpsubq_avx((undefined1  [16])local_48.end_time,(undefined1  [16])local_48.start_time);
  auVar3 = vpmullq_avx512vl(auVar1,_DAT_00106020);
  auVar1 = vpshufd_avx(auVar3,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar3);
  tVar4.result = uVar2;
  tVar4.time = auVar1._0_8_;
  return tVar4;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}